

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibverbs_communicator.cpp
# Opt level: O2

void __thiscall IBVerbsCommunicator::RecvWait(IBVerbsCommunicator *this,int src_rank)

{
  pointer ppVar1;
  bool bVar2;
  
  do {
    bVar2 = RecvPoll(this,src_rank);
  } while (!bVar2);
  ppVar1 = (this->mr_world_).
           super__Vector_base<std::pair<ibv_mr_*,_ibv_mr_*>,_std::allocator<std::pair<ibv_mr_*,_ibv_mr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar1[src_rank].second != (ibv_mr *)0x0) {
    ibv_dereg_mr();
    ppVar1[src_rank].second = (ibv_mr *)0x0;
  }
  return;
}

Assistant:

void IBVerbsCommunicator::RecvWait(int src_rank) {
  while (!RecvPoll(src_rank)) {
  }

  // unregister memory region from non-blocking io wait list
  auto& save = mr_world_[src_rank].second;
  if (save != NULL) {
    ibv_dereg_mr(save);
    save = NULL;
  }
}